

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O2

int Cec_ManSatSolveExractPattern(Vec_Int_t *vCexStore,int iStart,Vec_Int_t *vPat)

{
  int iVar1;
  int Entry;
  int i;
  bool bVar2;
  
  vPat->nSize = 0;
  i = iStart + 2;
  iVar1 = Vec_IntEntry(vCexStore,iStart + 1);
  if (0 < iVar1) {
    while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
      Entry = Vec_IntEntry(vCexStore,i);
      Vec_IntPush(vPat,Entry);
      i = i + 1;
    }
  }
  return i;
}

Assistant:

int Cec_ManSatSolveExractPattern( Vec_Int_t * vCexStore, int iStart, Vec_Int_t * vPat )
{
    int k, nSize;
    Vec_IntClear( vPat );
    // skip the output number
    iStart++;
    // get the number of items
    nSize = Vec_IntEntry( vCexStore, iStart++ );
    if ( nSize <= 0 )
        return iStart;
    // extract pattern
    for ( k = 0; k < nSize; k++ )
        Vec_IntPush( vPat, Vec_IntEntry( vCexStore, iStart++ ) );
    return iStart;
}